

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O1

void __thiscall CHud::RenderRaceTime(CHud *this,CNetObj_PlayerInfoRace *pRaceInfo)

{
  CNetObj_GameDataRace *pCVar1;
  ITextRender *pIVar2;
  CGameClient *pCVar3;
  IClient *pIVar4;
  IGraphics *pIVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  float extraout_XMM0_Da;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar8;
  char aBuf [32];
  float local_68 [4];
  char local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pRaceInfo != (CNetObj_PlayerInfoRace *)0x0) && (pRaceInfo->m_RaceStartTick != -1)) {
    pCVar1 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
    iVar7 = 3;
    iVar6 = 3;
    if (pCVar1 != (CNetObj_GameDataRace *)0x0) {
      iVar6 = pCVar1->m_Precision;
    }
    if (0 < iVar6) {
      iVar6 = 1;
    }
    FormatTime(local_58,0x20,0,iVar6);
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar2->super_IInterface)._vptr_IInterface[6])(0x41400000,pIVar2,local_58,0xffffffff);
    pCVar3 = (this->super_CComponent).m_pClient;
    pIVar4 = pCVar3->m_pClient;
    pCVar1 = (pCVar3->m_Snap).m_pGameDataRace;
    if (pCVar1 != (CNetObj_GameDataRace *)0x0) {
      iVar7 = pCVar1->m_Precision;
    }
    if (0 < iVar7) {
      iVar7 = 1;
    }
    FormatTime(local_58,0x20,
               ((pIVar4->m_CurGameTick - pRaceInfo->m_RaceStartTick) * 1000) /
               pIVar4->m_GameTickSpeed,iVar7);
    pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    iVar6 = pIVar5->m_ScreenWidth;
    iVar7 = pIVar5->m_ScreenHeight;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])
              (pIVar5,(ulong)(uint)g_pData->m_aImages[0x1a].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xb7,0,0,0);
    aVar8.x = ((float)iVar6 / (float)iVar7) * 300.0 * 0.5 - extraout_XMM0_Da * 0.5;
    local_68[0] = aVar8.x + -18.0;
    local_68[1] = 20.0;
    local_68[2] = 15.0;
    local_68[3] = 15.0;
    pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x1d])(pIVar5,local_68,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
    if (RenderRaceTime(CNetObj_PlayerInfoRace_const*)::s_Cursor == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderRaceTime(CNetObj_PlayerInfoRace_const*)::s_Cursor);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderRaceTime::s_Cursor,12.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderRaceTime::s_Cursor,&__dso_handle);
        __cxa_guard_release(&RenderRaceTime(CNetObj_PlayerInfoRace_const*)::s_Cursor);
      }
    }
    CTextCursor::Reset(&RenderRaceTime::s_Cursor,-1);
    RenderRaceTime::s_Cursor.m_CursorPos.field_1.y = 20.0;
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    RenderRaceTime::s_Cursor.m_CursorPos.field_0.x = aVar8.x;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderRaceTime::s_Cursor,local_58,0xffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderRaceTime(const CNetObj_PlayerInfoRace *pRaceInfo)
{
	if(!pRaceInfo || pRaceInfo->m_RaceStartTick == -1)
		return;

	char aBuf[32];

	FormatTime(aBuf, sizeof(aBuf), 0, minimum(m_pClient->RacePrecision(), 1));
	float TimeWidth = TextRender()->TextWidth(12, aBuf, -1);

	int RaceTime = (Client()->GameTick() - pRaceInfo->m_RaceStartTick)*1000/Client()->GameTickSpeed();
	FormatTime(aBuf, sizeof(aBuf), RaceTime, minimum(m_pClient->RacePrecision(), 1));

	float Half = 300.0f*Graphics()->ScreenAspect()/2.0f;

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_TIMERCLOCK].m_Id);
	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(SPRITE_TIMERCLOCK_A);
	IGraphics::CQuadItem QuadItem(Half-TimeWidth/2-18.f, 20, 15, 15);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();

	static CTextCursor s_Cursor(12);
	s_Cursor.Reset();
	s_Cursor.MoveTo(Half-TimeWidth/2, 20);
	TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
}